

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::moveAppend
          (QGenericArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          pair<QString,_QFileInfo> *e)

{
  pair<QString,_QFileInfo> *ppVar1;
  pair<QString,_QFileInfo> *ppVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  long lVar6;
  
  if ((b != e) && (b < e)) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).ptr;
    lVar6 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size;
    do {
      pDVar3 = (b->first).d.d;
      (b->first).d.d = (Data *)0x0;
      ppVar1 = ppVar2 + lVar6;
      (ppVar1->first).d.d = pDVar3;
      pcVar4 = (b->first).d.ptr;
      (b->first).d.ptr = (char16_t *)0x0;
      (ppVar1->first).d.ptr = pcVar4;
      qVar5 = (b->first).d.size;
      (b->first).d.size = 0;
      (ppVar1->first).d.size = qVar5;
      QFileInfo::QFileInfo(&ppVar1->second,&b->second);
      lVar6 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size + 1;
      (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size = lVar6;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }